

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

int ncnn::convolution1d(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int stride_w,int dilation_w,int activation_type,Mat *activation_params,
                       Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar9;
  float fVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int in_stack_00000008;
  undefined4 in_stack_00000010;
  long *in_stack_00000018;
  float wt;
  float val;
  int k;
  float *sptr;
  int q;
  float *kptr;
  float sum;
  int j;
  float *outptr;
  int p;
  int bias_term;
  int outh;
  int outw;
  int h;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_15c;
  int local_13c;
  float *local_138;
  int local_12c;
  long local_128;
  float local_120;
  int local_11c;
  int local_10c;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  long *local_60;
  float local_54 [3];
  long *local_48;
  undefined8 local_40;
  long *local_38;
  undefined8 local_30;
  long *local_28;
  undefined8 local_20;
  long *local_18;
  undefined8 local_10;
  long *local_8;
  undefined8 extraout_XMM0_Qb;
  
  lVar6 = in_RDI[6];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar7 = in_RSI[6];
  bVar9 = true;
  if (*in_RCX != 0) {
    bVar9 = in_RCX[8] * (long)(int)in_RCX[7] == 0;
  }
  for (local_10c = 0; local_10c < (int)lVar7; local_10c = local_10c + 1) {
    lVar4 = *in_RSI;
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[2];
    for (local_11c = 0; local_11c < iVar2; local_11c = local_11c + 1) {
      local_120 = 0.0;
      if (!bVar9) {
        local_120 = *(float *)(*in_RCX + (long)local_10c * 4);
      }
      local_128 = *in_RDX + (long)(in_R8D * (int)lVar6 * local_10c) * 4;
      for (local_12c = 0; local_12c < (int)lVar6; local_12c = local_12c + 1) {
        local_138 = (float *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)local_12c *
                                        in_RDI[2] + (long)(local_11c * in_R9D) * 4);
        for (local_13c = 0; local_13c < in_R8D; local_13c = local_13c + 1) {
          local_120 = *local_138 * *(float *)(local_128 + (long)local_13c * 4) + local_120;
          local_138 = local_138 + in_stack_00000008;
        }
        local_128 = local_128 + (long)in_R8D * 4;
      }
      local_54[0] = local_120;
      local_60 = in_stack_00000018;
      switch(in_stack_00000010) {
      case 1:
        dVar11 = std::fmax((double)(ulong)(uint)local_120,0.0);
        local_54[0] = SUB84(dVar11,0);
        break;
      case 2:
        local_8 = in_stack_00000018;
        local_10 = 0;
        local_64 = *(float *)*in_stack_00000018;
        if (local_120 <= 0.0) {
          local_15c = local_120 * local_64;
        }
        else {
          local_15c = local_120;
        }
        local_54[0] = local_15c;
        break;
      case 3:
        local_18 = in_stack_00000018;
        local_20 = 0;
        local_68 = *(float *)*in_stack_00000018;
        local_28 = in_stack_00000018;
        local_30 = 1;
        local_6c = *(float *)(*in_stack_00000018 + 4);
        if (local_120 < local_68) {
          local_54[0] = local_68;
        }
        if (local_6c < local_54[0]) {
          local_54[0] = local_6c;
        }
        break;
      case 4:
        local_70 = 88.37626;
        pfVar8 = std::min<float>(local_54,&local_70);
        local_54[0] = *pfVar8;
        local_74 = -88.37626;
        pfVar8 = std::max<float>(local_54,&local_74);
        local_54[0] = *pfVar8;
        dVar11 = std::exp((double)(ulong)(uint)-local_54[0]);
        local_54[0] = 1.0 / (SUB84(dVar11,0) + 1.0);
        break;
      case 5:
        auVar12._0_8_ = std::exp((double)(ulong)(uint)local_120);
        auVar12._8_8_ = extraout_XMM0_Qb;
        auVar13._4_12_ = auVar12._4_12_;
        auVar13._0_4_ = SUB84(auVar12._0_8_,0) + 1.0;
        dVar11 = std::log(auVar13._0_8_);
        dVar11 = std::tanh(dVar11);
        local_54[0] = local_120 * SUB84(dVar11,0);
        break;
      case 6:
        local_38 = in_stack_00000018;
        local_40 = 0;
        fVar1 = *(float *)*in_stack_00000018;
        local_48 = in_stack_00000018;
        local_54[1] = 1.4013e-45;
        local_54[2] = 0.0;
        fVar10 = -*(float *)(*in_stack_00000018 + 4) / fVar1;
        if (fVar10 <= local_120) {
          if (local_120 <= 1.0 / fVar1 + fVar10) {
            local_54[0] = local_120 * (local_120 * fVar1 + *(float *)(*in_stack_00000018 + 4));
          }
        }
        else {
          local_54[0] = 0.0;
        }
      }
      *(float *)(lVar4 + (long)iVar3 * (long)local_10c * lVar5 + (long)local_11c * 4) = local_54[0];
    }
  }
  return 0;
}

Assistant:

static int convolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        float* outptr = top_blob.row(p);

        for (int j = 0; j < outw; j++)
        {
            float sum = 0.f;

            if (bias_term)
                sum = bias_data[p];

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float* sptr = bottom_blob.row(q) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float wt = kptr[k];
                    sum += val * wt;

                    sptr += dilation_w;
                }

                kptr += kernel_w;
            }

            sum = activation_ss(sum, activation_type, activation_params);

            outptr[j] = sum;
        }
    }

    return 0;
}